

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O1

ssize_t __thiscall CSocekt::recvproc(CSocekt *this,lp_connection_t c,char *buff,ssize_t buflen)

{
  char *__dest;
  ssize_t sVar1;
  int *piVar2;
  LogStream *pLVar3;
  int iVar4;
  char **ppcVar5;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  Logger local_ff0;
  
  sVar1 = read(c->fd,buff,buflen);
  if (sVar1 == 0) {
    if (muduo::g_logLevel < 3) {
      file_00._8_8_ = 0x16;
      file_00.data_ = "flyd_socket_request.cc";
      muduo::Logger::Logger(&local_ff0,file_00,0x73);
      if (0x33 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,
                        "连接被客户端正常关闭[4路挥手关闭]！",0x33);
        local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x33;
      }
LAB_00115250:
      muduo::Logger::~Logger(&local_ff0);
    }
LAB_0011525a:
    zdClosesocketProc(this,c);
  }
  else {
    if (-1 < sVar1) {
      return sVar1;
    }
    if (muduo::g_logLevel < 3) {
      file._8_8_ = 0x16;
      file.data_ = "flyd_socket_request.cc";
      muduo::Logger::Logger(&local_ff0,file,0x7b);
      if (0xe < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,"errno的值是",0xe);
        local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0xe;
      }
      piVar2 = __errno_location();
      muduo::LogStream::operator<<(&local_ff0.impl_.stream_,*piVar2);
      muduo::Logger::~Logger(&local_ff0);
    }
    piVar2 = __errno_location();
    iVar4 = *piVar2;
    if (iVar4 == 4) {
      iVar4 = 0x89;
    }
    else {
      if (iVar4 == 0x68) goto LAB_0011525a;
      if (iVar4 != 0xb) {
        file_02._8_8_ = 0x16;
        file_02.data_ = "flyd_socket_request.cc";
        muduo::Logger::Logger(&local_ff0,file_02,0x9d,ERROR);
        pLVar3 = muduo::LogStream::operator<<(&local_ff0.impl_.stream_,*piVar2);
        ppcVar5 = &(pLVar3->buffer_).cur_;
        __dest = (pLVar3->buffer_).cur_;
        if (0x49 < (uint)((int)ppcVar5 - (int)__dest)) {
          memcpy(__dest,anon_var_dwarf_35075,0x49);
          *ppcVar5 = *ppcVar5 + 0x49;
        }
        goto LAB_00115250;
      }
      iVar4 = 0x80;
    }
    file_01._8_8_ = 0x16;
    file_01.data_ = "flyd_socket_request.cc";
    muduo::Logger::Logger(&local_ff0,file_01,iVar4,ERROR);
    if (0x58 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
      memcpy(local_ff0.impl_.stream_.buffer_.cur_,anon_var_dwarf_3505f,0x58);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x58;
    }
    muduo::Logger::~Logger(&local_ff0);
  }
  return -1;
}

Assistant:

ssize_t CSocekt::recvproc(lp_connection_t c,char *buff,ssize_t buflen)  //ssize_t是有符号整型，在32位机器上等同与int，在64位机器上等同与long int，size_t就是无符号型的ssize_t
{
    ssize_t n;

    n = read(c->fd, buff, buflen); //recv()系统函数， 最后一个参数flag，一般为0；
    if(n == 0)
    {
        //客户端关闭【应该是正常完成了4次挥手】，我这边就直接回收连接连接，关闭socket即可
        LOG_INFO << "连接被客户端正常关闭[4路挥手关闭]！";
        //flyd_close_connection(c);不再是直接关闭连接，而是先从时间队列中去除，再延迟关闭
        zdClosesocketProc(c);
        return -1;
    }
    //客户端没断，走这里
    if(n < 0) //这被认为有错误发生
    {
        LOG_INFO << "errno的值是" << errno;
        //EAGAIN和EWOULDBLOCK[【这个应该常用在hp上】应该是一样的值，表示没收到数据，一般来讲，在ET模式下会出现这个错误，因为ET模式下是不停的recv肯定有一个时刻收到这个errno，但LT模式下一般是来事件才收，所以不该出现这个返回值
        if(errno == EAGAIN || errno == EWOULDBLOCK)
        {
            //我认为LT模式不该出现这个errno，而且这个其实也不是错误，所以不当做错误处理
            LOG_ERROR << "CSocekt::recvproc()中errno == EAGAIN || errno == EWOULDBLOCK成立，出乎我意料！";
            return -1; //不当做错误处理，只是简单返回
        }
        //EINTR错误的产生：当阻塞于某个慢系统调用的一个进程捕获某个信号且相应信号处理函数返回时，该系统调用可能返回一个EINTR错误。
        //例如：在socket服务器端，设置了信号捕获机制，有子进程，当在父进程阻塞于慢系统调用时由父进程捕获到了一个有效信号时，内核会致使accept返回一个EINTR错误(被中断的系统调用)。
        if(errno == EINTR)  //这个不算错误，是我参考官方nginx，官方nginx这个就不算错误；
        {
            //我认为LT模式不该出现这个errno，而且这个其实也不是错误，所以不当做错误处理
            //ngx_log_stderr(errno,"CSocekt::recvproc()中errno == EINTR成立，出乎我意料！");//epoll为LT模式不应该出现这个返回值，所以直接打印出来瞧瞧
            LOG_ERROR << "CSocekt::recvproc()中errno == EAGAIN || errno == EWOULDBLOCK成立，出乎我意料！";
            return -1; //不当做错误处理，只是简单返回
        }

        //所有从这里走下来的错误，都认为异常：意味着我们要关闭客户端套接字要回收连接池中连接；

        //errno参考：http://dhfapiran1.360drm.com
        if(errno == ECONNRESET)  //#define ECONNRESET 104 /* Connection reset by peer */
        {
            //如果客户端没有正常关闭socket连接，却关闭了整个运行程序【真是够粗暴无理的，应该是直接给服务器发送rst包而不是4次挥手包完成连接断开】，那么会产生这个错误
            //10054(WSAECONNRESET)--远程程序正在连接的时候关闭会产生这个错误--远程主机强迫关闭了一个现有的连接
            //算常规错误吧【普通信息型】，日志都不用打印，没啥意思，太普通的错误
            //do nothing

            //....一些大家遇到的很普通的错误信息，也可以往这里增加各种，代码要慢慢完善，一步到位，不可能，很多服务器程序经过很多年的完善才比较圆满；
        }
        else
        {
            //能走到这里的，都表示错误，我打印一下日志，希望知道一下是啥错误，我准备打印到屏幕上
           // ngx_log_stderr(errno,"CSocekt::recvproc()中发生错误，我打印出来看看是啥错误！");  //正式运营时可以考虑这些日志打印去掉
            LOG_ERROR << errno << "CSocekt::recvproc()中发生错误，我打印出来看看是啥错误！";
        }

        //ngx_log_stderr(0,"连接被客户端 非 正常关闭！");

        //这种真正的错误就要，直接关闭套接字，释放连接池中连接了
       // flyd_close_connection(c);
       zdClosesocketProc(c);
        return -1;
    }

    //能走到这里的，就认为收到了有效数据
    return n; //返回收到的字节数
}